

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * exprListAppendList(Parse *pParse,ExprList *pList,ExprList *pAppend,int bIntToNull)

{
  Expr *pExpr;
  int local_3c;
  Expr *pDup;
  int local_28;
  int nInit;
  int i;
  int bIntToNull_local;
  ExprList *pAppend_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  pAppend_local = pList;
  if (pAppend != (ExprList *)0x0) {
    if (pList == (ExprList *)0x0) {
      local_3c = 0;
    }
    else {
      local_3c = pList->nExpr;
    }
    for (local_28 = 0; local_28 < pAppend->nExpr; local_28 = local_28 + 1) {
      pExpr = sqlite3ExprDup(pParse->db,pAppend->a[local_28].pExpr,0);
      if (((bIntToNull != 0) && (pExpr != (Expr *)0x0)) && (pExpr->op == 0x93)) {
        pExpr->op = 'r';
        pExpr->flags = pExpr->flags & 0xcffffbff;
      }
      pAppend_local = sqlite3ExprListAppend(pParse,pAppend_local,pExpr);
      if (pAppend_local != (ExprList *)0x0) {
        pAppend_local->a[local_3c + local_28].sortOrder = pAppend->a[local_28].sortOrder;
      }
    }
  }
  return pAppend_local;
}

Assistant:

static ExprList *exprListAppendList(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  ExprList *pAppend,      /* List of values to append. Might be NULL */
  int bIntToNull
){
  if( pAppend ){
    int i;
    int nInit = pList ? pList->nExpr : 0;
    for(i=0; i<pAppend->nExpr; i++){
      Expr *pDup = sqlite3ExprDup(pParse->db, pAppend->a[i].pExpr, 0);
      if( bIntToNull && pDup && pDup->op==TK_INTEGER ){
        pDup->op = TK_NULL;
        pDup->flags &= ~(EP_IntValue|EP_IsTrue|EP_IsFalse);
      }
      pList = sqlite3ExprListAppend(pParse, pList, pDup);
      if( pList ) pList->a[nInit+i].sortOrder = pAppend->a[i].sortOrder;
    }
  }
  return pList;
}